

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::EventLog::InitializeEventListVTable(EventLog *this)

{
  EventLogEntryVTableEntry *pEVar1;
  undefined4 local_d00 [2];
  code *local_cf8;
  code *local_cf0;
  code *local_ce8;
  code *local_ce0;
  undefined8 local_cd8;
  undefined4 local_cd0 [2];
  code *local_cc8;
  code *local_cc0;
  code *local_cb8;
  code *local_cb0;
  undefined8 local_ca8;
  undefined4 local_ca0 [2];
  code *local_c98;
  code *local_c90;
  code *local_c88;
  code *local_c80;
  undefined8 local_c78;
  undefined4 local_c70 [2];
  code *local_c68;
  code *local_c60;
  code *local_c58;
  code *local_c50;
  undefined8 local_c48;
  undefined4 local_c40 [2];
  code *local_c38;
  code *local_c30;
  code *local_c28;
  code *local_c20;
  undefined8 local_c18;
  undefined4 local_c10 [2];
  code *local_c08;
  code *local_c00;
  code *local_bf8;
  code *local_bf0;
  undefined8 local_be8;
  undefined4 local_be0 [2];
  code *local_bd8;
  undefined8 local_bd0;
  code *local_bc8;
  code *local_bc0;
  undefined8 local_bb8;
  undefined4 local_bb0 [2];
  code *local_ba8;
  undefined8 local_ba0;
  code *local_b98;
  code *local_b90;
  undefined8 local_b88;
  undefined4 local_b80 [2];
  code *local_b78;
  undefined8 local_b70;
  code *local_b68;
  code *local_b60;
  undefined8 local_b58;
  undefined4 local_b50 [2];
  code *local_b48;
  undefined8 local_b40;
  code *local_b38;
  code *local_b30;
  undefined8 local_b28;
  undefined4 local_b20 [2];
  code *local_b18;
  undefined8 local_b10;
  code *local_b08;
  code *local_b00;
  undefined8 local_af8;
  undefined4 local_af0 [2];
  code *local_ae8;
  undefined8 local_ae0;
  code *local_ad8;
  code *local_ad0;
  undefined8 local_ac8;
  undefined4 local_ac0 [2];
  code *local_ab8;
  undefined8 local_ab0;
  code *local_aa8;
  code *local_aa0;
  undefined8 local_a98;
  undefined4 local_a90 [2];
  code *local_a88;
  undefined8 local_a80;
  code *local_a78;
  code *local_a70;
  undefined8 local_a68;
  undefined4 local_a60 [2];
  code *local_a58;
  undefined8 local_a50;
  code *local_a48;
  code *local_a40;
  undefined8 local_a38;
  undefined4 local_a30 [2];
  code *local_a28;
  undefined8 local_a20;
  code *local_a18;
  code *local_a10;
  undefined8 local_a08;
  undefined4 local_a00 [2];
  code *local_9f8;
  undefined8 local_9f0;
  code *local_9e8;
  code *local_9e0;
  undefined8 local_9d8;
  undefined4 local_9d0 [2];
  code *local_9c8;
  undefined8 local_9c0;
  code *local_9b8;
  code *local_9b0;
  undefined8 local_9a8;
  undefined4 local_9a0 [2];
  code *local_998;
  undefined8 local_990;
  code *local_988;
  code *local_980;
  undefined8 local_978;
  undefined4 local_970 [2];
  code *local_968;
  undefined8 local_960;
  code *local_958;
  code *local_950;
  undefined8 local_948;
  undefined4 local_940 [2];
  code *local_938;
  undefined8 local_930;
  code *local_928;
  code *local_920;
  undefined8 local_918;
  undefined4 local_910 [2];
  code *local_908;
  undefined8 local_900;
  code *local_8f8;
  code *local_8f0;
  undefined8 local_8e8;
  undefined4 local_8e0 [2];
  code *local_8d8;
  undefined8 local_8d0;
  code *local_8c8;
  code *local_8c0;
  undefined8 local_8b8;
  undefined4 local_8b0 [2];
  code *local_8a8;
  undefined8 local_8a0;
  code *local_898;
  code *local_890;
  undefined8 local_888;
  undefined4 local_880 [2];
  code *local_878;
  undefined8 local_870;
  code *local_868;
  code *local_860;
  undefined8 local_858;
  undefined4 local_850 [2];
  code *local_848;
  undefined8 local_840;
  code *local_838;
  code *local_830;
  undefined8 local_828;
  undefined4 local_820 [2];
  code *local_818;
  undefined8 local_810;
  code *local_808;
  code *local_800;
  undefined8 local_7f8;
  undefined4 local_7f0 [2];
  code *local_7e8;
  undefined8 local_7e0;
  code *local_7d8;
  code *local_7d0;
  undefined8 local_7c8;
  undefined4 local_7c0 [2];
  code *local_7b8;
  undefined8 local_7b0;
  code *local_7a8;
  code *local_7a0;
  undefined8 local_798;
  undefined4 local_790 [2];
  code *local_788;
  undefined8 local_780;
  code *local_778;
  code *local_770;
  undefined8 local_768;
  undefined4 local_760 [2];
  code *local_758;
  undefined8 local_750;
  code *local_748;
  code *local_740;
  undefined8 local_738;
  undefined4 local_730 [2];
  code *local_728;
  code *local_720;
  code *local_718;
  code *local_710;
  undefined8 local_708;
  undefined4 local_700 [2];
  code *local_6f8;
  undefined8 local_6f0;
  code *local_6e8;
  code *local_6e0;
  undefined8 local_6d8;
  undefined4 local_6d0 [2];
  code *local_6c8;
  undefined8 local_6c0;
  code *local_6b8;
  code *local_6b0;
  undefined8 local_6a8;
  undefined4 local_6a0 [2];
  code *local_698;
  undefined8 local_690;
  code *local_688;
  code *local_680;
  undefined8 local_678;
  undefined4 local_670 [2];
  code *local_668;
  undefined8 local_660;
  code *local_658;
  code *local_650;
  undefined8 local_648;
  undefined4 local_640 [2];
  code *local_638;
  undefined8 local_630;
  code *local_628;
  code *local_620;
  undefined8 local_618;
  undefined4 local_610 [2];
  code *local_608;
  undefined8 local_600;
  code *local_5f8;
  code *local_5f0;
  undefined8 local_5e8;
  undefined4 local_5e0 [2];
  code *local_5d8;
  undefined8 local_5d0;
  code *local_5c8;
  code *local_5c0;
  undefined8 local_5b8;
  undefined4 local_5b0 [2];
  code *local_5a8;
  undefined8 local_5a0;
  code *local_598;
  code *local_590;
  undefined8 local_588;
  undefined4 local_580 [2];
  code *local_578;
  undefined8 local_570;
  code *local_568;
  code *local_560;
  undefined8 local_558;
  undefined4 local_550 [2];
  code *local_548;
  undefined8 local_540;
  code *local_538;
  code *local_530;
  undefined8 local_528;
  undefined4 local_520 [2];
  code *local_518;
  undefined8 local_510;
  code *local_508;
  code *local_500;
  undefined8 local_4f8;
  undefined4 local_4f0 [2];
  code *local_4e8;
  undefined8 local_4e0;
  code *local_4d8;
  code *local_4d0;
  undefined8 local_4c8;
  undefined4 local_4c0 [2];
  code *local_4b8;
  undefined8 local_4b0;
  code *local_4a8;
  code *local_4a0;
  undefined8 local_498;
  undefined4 local_490 [2];
  code *local_488;
  undefined8 local_480;
  code *local_478;
  code *local_470;
  undefined8 local_468;
  undefined4 local_460 [2];
  code *local_458;
  undefined8 local_450;
  code *local_448;
  code *local_440;
  undefined8 local_438;
  undefined4 local_430 [2];
  code *local_428;
  undefined8 local_420;
  code *local_418;
  code *local_410;
  undefined8 local_408;
  undefined4 local_400 [2];
  code *local_3f8;
  undefined8 local_3f0;
  code *local_3e8;
  code *local_3e0;
  undefined8 local_3d8;
  undefined4 local_3d0 [2];
  code *local_3c8;
  code *local_3c0;
  code *local_3b8;
  code *local_3b0;
  undefined8 local_3a8;
  undefined4 local_3a0 [2];
  code *local_398;
  undefined8 local_390;
  code *local_388;
  code *local_380;
  undefined8 local_378;
  undefined4 local_370 [2];
  code *local_368;
  undefined8 local_360;
  code *local_358;
  code *local_350;
  undefined8 local_348;
  undefined4 local_340 [2];
  code *local_338;
  undefined8 local_330;
  code *local_328;
  code *local_320;
  undefined8 local_318;
  undefined4 local_310 [2];
  code *local_308;
  code *local_300;
  code *local_2f8;
  code *local_2f0;
  undefined8 local_2e8;
  undefined4 local_2e0 [2];
  undefined8 local_2d8;
  undefined8 local_2d0;
  code *local_2c8;
  code *local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0 [2];
  undefined8 local_2a8;
  undefined8 local_2a0;
  code *local_298;
  code *local_290;
  undefined8 local_288;
  undefined4 local_280 [2];
  undefined8 local_278;
  undefined8 local_270;
  code *local_268;
  code *local_260;
  undefined8 local_258;
  undefined4 local_250 [2];
  undefined8 local_248;
  code *local_240;
  code *local_238;
  code *local_230;
  undefined8 local_228;
  undefined4 local_220 [2];
  undefined8 local_218;
  undefined8 local_210;
  code *local_208;
  code *local_200;
  undefined8 local_1f8;
  undefined4 local_1f0 [2];
  undefined8 local_1e8;
  undefined8 local_1e0;
  code *local_1d8;
  code *local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0 [2];
  undefined8 local_1b8;
  undefined8 local_1b0;
  code *local_1a8;
  code *local_1a0;
  undefined8 local_198;
  undefined4 local_190 [2];
  undefined8 local_188;
  code *local_180;
  code *local_178;
  code *local_170;
  undefined8 local_168;
  undefined4 local_160 [2];
  undefined8 local_158;
  undefined8 local_150;
  code *local_148;
  code *local_140;
  undefined8 local_138;
  undefined4 local_130 [2];
  undefined8 local_128;
  code *local_120;
  code *local_118;
  code *local_110;
  undefined8 local_108;
  undefined4 local_100 [2];
  undefined8 local_f8;
  undefined8 local_f0;
  code *local_e8;
  code *local_e0;
  undefined8 local_d8;
  undefined4 local_d0 [2];
  undefined8 local_c8;
  code *local_c0;
  code *local_b8;
  code *local_b0;
  undefined8 local_a8;
  undefined4 local_a0 [2];
  undefined8 local_98;
  undefined8 local_90;
  code *local_88;
  code *local_80;
  undefined8 local_78;
  undefined4 local_70 [2];
  undefined8 local_68;
  undefined8 local_60;
  code *local_58;
  code *local_50;
  undefined8 local_48;
  undefined4 local_40 [2];
  undefined8 local_38;
  code *local_30;
  code *local_28;
  code *local_20;
  undefined8 local_18;
  EventLog *local_10;
  EventLog *this_local;
  
  local_10 = this;
  pEVar1 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSLogEvents::EventLogEntryVTableEntry>
                     (&this->m_miscSlabAllocator,0x47);
  this->m_eventListVTable = pEVar1;
  local_40[0] = 1;
  local_38 = 0;
  local_30 = NSLogEvents::SnapshotEventLogEntry_UnloadEventMemory;
  local_28 = NSLogEvents::SnapshotEventLogEntry_Emit;
  local_20 = NSLogEvents::SnapshotEventLogEntry_Parse;
  local_18 = 0x40;
  memcpy(this->m_eventListVTable + 1,local_40,0x30);
  local_70[0] = 1;
  local_68 = 0;
  local_60 = 0;
  local_58 = NSLogEvents::EventLoopYieldPointEntry_Emit;
  local_50 = NSLogEvents::EventLoopYieldPointEntry_Parse;
  local_48 = 0x20;
  memcpy(this->m_eventListVTable + 2,local_70,0x30);
  local_a0[0] = 0;
  local_98 = 0;
  local_90 = 0;
  local_88 = NSLogEvents::CodeLoadEventLogEntry_Emit;
  local_80 = NSLogEvents::CodeLoadEventLogEntry_Parse;
  local_78 = 0x14;
  memcpy(this->m_eventListVTable + 3,local_a0,0x30);
  local_d0[0] = 0;
  local_c8 = 0;
  local_c0 = NSLogEvents::TelemetryEventLogEntry_UnloadEventMemory;
  local_b8 = NSLogEvents::TelemetryEventLogEntry_Emit;
  local_b0 = NSLogEvents::TelemetryEventLogEntry_Parse;
  local_a8 = 0x28;
  memcpy(this->m_eventListVTable + 4,local_d0,0x30);
  local_100[0] = 0;
  local_f8 = 0;
  local_f0 = 0;
  local_e8 = NSLogEvents::DoubleEventLogEntry_Emit;
  local_e0 = NSLogEvents::DoubleEventLogEntry_Parse;
  local_d8 = 0x18;
  memcpy(this->m_eventListVTable + 5,local_100,0x30);
  local_130[0] = 0;
  local_128 = 0;
  local_120 = NSLogEvents::StringValueEventLogEntry_UnloadEventMemory;
  local_118 = NSLogEvents::StringValueEventLogEntry_Emit;
  local_110 = NSLogEvents::StringValueEventLogEntry_Parse;
  local_108 = 0x20;
  memcpy(this->m_eventListVTable + 6,local_130,0x30);
  local_160[0] = 0;
  local_158 = 0;
  local_150 = 0;
  local_148 = NSLogEvents::RandomSeedEventLogEntry_Emit;
  local_140 = NSLogEvents::RandomSeedEventLogEntry_Parse;
  local_138 = 0x20;
  memcpy(this->m_eventListVTable + 7,local_160,0x30);
  local_190[0] = 0;
  local_188 = 0;
  local_180 = NSLogEvents::PropertyEnumStepEventLogEntry_UnloadEventMemory;
  local_178 = NSLogEvents::PropertyEnumStepEventLogEntry_Emit;
  local_170 = NSLogEvents::PropertyEnumStepEventLogEntry_Parse;
  local_168 = 0x30;
  memcpy(this->m_eventListVTable + 8,local_190,0x30);
  local_1c0[0] = 0;
  local_1b8 = 0;
  local_1b0 = 0;
  local_1a8 = NSLogEvents::SymbolCreationEventLogEntry_Emit;
  local_1a0 = NSLogEvents::SymbolCreationEventLogEntry_Parse;
  local_198 = 0x14;
  memcpy(this->m_eventListVTable + 9,local_1c0,0x30);
  local_1f0[0] = 0;
  local_1e8 = 0;
  local_1e0 = 0;
  local_1d8 = NSLogEvents::WeakCollectionContainsEventLogEntry_Emit;
  local_1d0 = NSLogEvents::WeakCollectionContainsEventLogEntry_Parse;
  local_1c8 = 0x14;
  memcpy(this->m_eventListVTable + 10,local_1f0,0x30);
  local_220[0] = 0;
  local_218 = 0;
  local_210 = 0;
  local_208 = NSLogEvents::ExternalCbRegisterCallEventLogEntry_Emit;
  local_200 = NSLogEvents::ExternalCbRegisterCallEventLogEntry_Parse;
  local_1f8 = 0x20;
  memcpy(this->m_eventListVTable + 0xb,local_220,0x30);
  local_250[0] = 0;
  local_248 = 0;
  local_240 = NSLogEvents::ExternalCallEventLogEntry_UnloadEventMemory;
  local_238 = NSLogEvents::ExternalCallEventLogEntry_Emit;
  local_230 = NSLogEvents::ExternalCallEventLogEntry_Parse;
  local_228 = 0x50;
  memcpy(this->m_eventListVTable + 0xc,local_250,0x30);
  local_280[0] = 0;
  local_278 = 0;
  local_270 = 0;
  local_268 = NSLogEvents::ExplicitLogWriteEntry_Emit;
  local_260 = NSLogEvents::ExplicitLogWriteEntry_Parse;
  local_258 = 0x14;
  memcpy(this->m_eventListVTable + 0xd,local_280,0x30);
  local_2b0[0] = 0;
  local_2a8 = 0;
  local_2a0 = 0;
  local_298 = NSLogEvents::TTDInnerLoopLogWriteEventLogEntry_Emit;
  local_290 = NSLogEvents::TTDInnerLoopLogWriteEventLogEntry_Parse;
  local_288 = 0x48;
  memcpy(this->m_eventListVTable + 0xe,local_2b0,0x30);
  local_2e0[0] = 0;
  local_2d8 = 0;
  local_2d0 = 0;
  local_2c8 = NSLogEvents::TTDFetchAutoTraceStatusEventLogEntry_Emit;
  local_2c0 = NSLogEvents::TTDFetchAutoTraceStatusEventLogEntry_Parse;
  local_2b8 = 0x14;
  memcpy(this->m_eventListVTable + 0xf,local_2e0,0x30);
  local_310[0] = 1;
  local_308 = NSLogEvents::CreateScriptContext_Execute;
  local_300 = NSLogEvents::CreateScriptContext_UnloadEventMemory;
  local_2f8 = NSLogEvents::CreateScriptContext_Emit;
  local_2f0 = NSLogEvents::CreateScriptContext_Parse;
  local_2e8 = 0x20;
  memcpy(this->m_eventListVTable + 0x11,local_310,0x30);
  local_340[0] = 1;
  local_338 = NSLogEvents::SetActiveScriptContext_Execute;
  local_330 = 0;
  local_328 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)18>;
  local_320 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)18>;
  local_318 = 0x20;
  memcpy(this->m_eventListVTable + 0x12,local_340,0x30);
  local_370[0] = 3;
  local_368 = NSLogEvents::CreateNumber_Execute;
  local_360 = 0;
  local_358 = NSLogEvents::JsRTDoubleArgumentAction_Emit<(TTD::NSLogEvents::EventKind)19>;
  local_350 = NSLogEvents::JsRTDoubleArgumentAction_Parse<(TTD::NSLogEvents::EventKind)19>;
  local_348 = 0x20;
  memcpy(this->m_eventListVTable + 0x13,local_370,0x30);
  local_3a0[0] = 3;
  local_398 = NSLogEvents::CreateBoolean_Execute;
  local_390 = 0;
  local_388 = NSLogEvents::JsRTIntegralArgumentAction_Emit<(TTD::NSLogEvents::EventKind)20>;
  local_380 = NSLogEvents::JsRTIntegralArgumentAction_Parse<(TTD::NSLogEvents::EventKind)20>;
  local_378 = 0x20;
  memcpy(this->m_eventListVTable + 0x14,local_3a0,0x30);
  local_3d0[0] = 3;
  local_3c8 = NSLogEvents::CreateString_Execute;
  local_3c0 = NSLogEvents::
              JsRTStringArgumentAction_UnloadEventMemory<(TTD::NSLogEvents::EventKind)21>;
  local_3b8 = NSLogEvents::JsRTStringArgumentAction_Emit<(TTD::NSLogEvents::EventKind)21>;
  local_3b0 = NSLogEvents::JsRTStringArgumentAction_Parse<(TTD::NSLogEvents::EventKind)21>;
  local_3a8 = 0x28;
  memcpy(this->m_eventListVTable + 0x15,local_3d0,0x30);
  local_400[0] = 2;
  local_3f8 = NSLogEvents::CreateSymbol_Execute;
  local_3f0 = 0;
  local_3e8 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)22>;
  local_3e0 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)22>;
  local_3d8 = 0x20;
  memcpy(this->m_eventListVTable + 0x16,local_400,0x30);
  local_430[0] = 2;
  local_428 = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)23>;
  local_420 = 0;
  local_418 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)23>;
  local_410 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)23>;
  local_408 = 0x20;
  memcpy(this->m_eventListVTable + 0x17,local_430,0x30);
  local_460[0] = 2;
  local_458 = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)24>;
  local_450 = 0;
  local_448 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)24>;
  local_440 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)24>;
  local_438 = 0x20;
  memcpy(this->m_eventListVTable + 0x18,local_460,0x30);
  local_490[0] = 2;
  local_488 = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)25>;
  local_480 = 0;
  local_478 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)25>;
  local_470 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)25>;
  local_468 = 0x20;
  memcpy(this->m_eventListVTable + 0x19,local_490,0x30);
  local_4c0[0] = 2;
  local_4b8 = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)26>;
  local_4b0 = 0;
  local_4a8 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)26>;
  local_4a0 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)26>;
  local_498 = 0x20;
  memcpy(this->m_eventListVTable + 0x1a,local_4c0,0x30);
  local_4f0[0] = 2;
  local_4e8 = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)27>;
  local_4e0 = 0;
  local_4d8 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)27>;
  local_4d0 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)27>;
  local_4c8 = 0x20;
  memcpy(this->m_eventListVTable + 0x1b,local_4f0,0x30);
  local_520[0] = 2;
  local_518 = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)28>;
  local_510 = 0;
  local_508 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)28>;
  local_500 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)28>;
  local_4f8 = 0x20;
  memcpy(this->m_eventListVTable + 0x1c,local_520,0x30);
  local_550[0] = 2;
  local_548 = NSLogEvents::VarConvertToNumber_Execute;
  local_540 = 0;
  local_538 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)29>;
  local_530 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)29>;
  local_528 = 0x20;
  memcpy(this->m_eventListVTable + 0x1d,local_550,0x30);
  local_580[0] = 2;
  local_578 = NSLogEvents::VarConvertToBoolean_Execute;
  local_570 = 0;
  local_568 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)30>;
  local_560 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)30>;
  local_558 = 0x20;
  memcpy(this->m_eventListVTable + 0x1e,local_580,0x30);
  local_5b0[0] = 2;
  local_5a8 = NSLogEvents::VarConvertToString_Execute;
  local_5a0 = 0;
  local_598 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)31>;
  local_590 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)31>;
  local_588 = 0x20;
  memcpy(this->m_eventListVTable + 0x1f,local_5b0,0x30);
  local_5e0[0] = 2;
  local_5d8 = NSLogEvents::VarConvertToObject_Execute;
  local_5d0 = 0;
  local_5c8 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)32>;
  local_5c0 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)32>;
  local_5b8 = 0x20;
  memcpy(this->m_eventListVTable + 0x20,local_5e0,0x30);
  local_610[0] = 1;
  local_608 = NSLogEvents::AddRootRef_Execute;
  local_600 = 0;
  local_5f8 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)33>;
  local_5f0 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)33>;
  local_5e8 = 0x20;
  memcpy(this->m_eventListVTable + 0x21,local_610,0x30);
  local_640[0] = 1;
  local_638 = NSLogEvents::AddWeakRootRef_Execute;
  local_630 = 0;
  local_628 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)34>;
  local_620 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)34>;
  local_618 = 0x20;
  memcpy(this->m_eventListVTable + 0x22,local_640,0x30);
  local_670[0] = 3;
  local_668 = NSLogEvents::AllocateObject_Execute;
  local_660 = 0;
  local_658 = NSLogEvents::JsRTResultOnlyAction_Emit<(TTD::NSLogEvents::EventKind)35>;
  local_650 = NSLogEvents::JsRTResultOnlyAction_Parse<(TTD::NSLogEvents::EventKind)35>;
  local_648 = 0x18;
  memcpy(this->m_eventListVTable + 0x23,local_670,0x30);
  local_6a0[0] = 3;
  local_698 = NSLogEvents::AllocateExternalObject_Execute;
  local_690 = 0;
  local_688 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)36>;
  local_680 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)36>;
  local_678 = 0x20;
  memcpy(this->m_eventListVTable + 0x24,local_6a0,0x30);
  local_6d0[0] = 3;
  local_6c8 = NSLogEvents::AllocateArrayAction_Execute;
  local_6c0 = 0;
  local_6b8 = NSLogEvents::JsRTIntegralArgumentAction_Emit<(TTD::NSLogEvents::EventKind)37>;
  local_6b0 = NSLogEvents::JsRTIntegralArgumentAction_Parse<(TTD::NSLogEvents::EventKind)37>;
  local_6a8 = 0x20;
  memcpy(this->m_eventListVTable + 0x25,local_6d0,0x30);
  local_700[0] = 2;
  local_6f8 = NSLogEvents::AllocateArrayBufferAction_Execute;
  local_6f0 = 0;
  local_6e8 = NSLogEvents::JsRTIntegralArgumentAction_Emit<(TTD::NSLogEvents::EventKind)38>;
  local_6e0 = NSLogEvents::JsRTIntegralArgumentAction_Parse<(TTD::NSLogEvents::EventKind)38>;
  local_6d8 = 0x20;
  memcpy(this->m_eventListVTable + 0x26,local_700,0x30);
  local_730[0] = 3;
  local_728 = NSLogEvents::AllocateExternalArrayBufferAction_Execute;
  local_720 = NSLogEvents::JsRTByteBufferAction_UnloadEventMemory<(TTD::NSLogEvents::EventKind)39>;
  local_718 = NSLogEvents::JsRTByteBufferAction_Emit<(TTD::NSLogEvents::EventKind)39>;
  local_710 = NSLogEvents::JsRTByteBufferAction_Parse<(TTD::NSLogEvents::EventKind)39>;
  local_708 = 0x28;
  memcpy(this->m_eventListVTable + 0x27,local_730,0x30);
  local_760[0] = 2;
  local_758 = NSLogEvents::AllocateFunctionAction_Execute;
  local_750 = 0;
  local_748 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)40>;
  local_740 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)40>;
  local_738 = 0x20;
  memcpy(this->m_eventListVTable + 0x28,local_760,0x30);
  local_790[0] = 2;
  local_788 = NSLogEvents::HostProcessExitAction_Execute;
  local_780 = 0;
  local_778 = NSLogEvents::JsRTIntegralArgumentAction_Emit<(TTD::NSLogEvents::EventKind)41>;
  local_770 = NSLogEvents::JsRTIntegralArgumentAction_Parse<(TTD::NSLogEvents::EventKind)41>;
  local_768 = 0x20;
  memcpy(this->m_eventListVTable + 0x29,local_790,0x30);
  local_7c0[0] = 0;
  local_7b8 = NSLogEvents::GetAndClearExceptionWithMetadataAction_Execute;
  local_7b0 = 0;
  local_7a8 = NSLogEvents::JsRTResultOnlyAction_Emit<(TTD::NSLogEvents::EventKind)42>;
  local_7a0 = NSLogEvents::JsRTResultOnlyAction_Parse<(TTD::NSLogEvents::EventKind)42>;
  local_798 = 0x18;
  memcpy(this->m_eventListVTable + 0x2a,local_7c0,0x30);
  local_7f0[0] = 0;
  local_7e8 = NSLogEvents::GetAndClearExceptionAction_Execute;
  local_7e0 = 0;
  local_7d8 = NSLogEvents::JsRTResultOnlyAction_Emit<(TTD::NSLogEvents::EventKind)43>;
  local_7d0 = NSLogEvents::JsRTResultOnlyAction_Parse<(TTD::NSLogEvents::EventKind)43>;
  local_7c8 = 0x18;
  memcpy(this->m_eventListVTable + 0x2b,local_7f0,0x30);
  local_820[0] = 3;
  local_818 = NSLogEvents::SetExceptionAction_Execute;
  local_810 = 0;
  local_808 = NSLogEvents::JsRTSingleVarScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)44>;
  local_800 = NSLogEvents::JsRTSingleVarScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)44>;
  local_7f8 = 0x28;
  memcpy(this->m_eventListVTable + 0x2c,local_820,0x30);
  local_850[0] = 2;
  local_848 = NSLogEvents::HasPropertyAction_Execute;
  local_840 = 0;
  local_838 = NSLogEvents::JsRTSingleVarScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)45>;
  local_830 = NSLogEvents::JsRTSingleVarScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)45>;
  local_828 = 0x28;
  memcpy(this->m_eventListVTable + 0x2d,local_850,0x30);
  local_880[0] = 2;
  local_878 = NSLogEvents::HasOwnPropertyAction_Execute;
  local_870 = 0;
  local_868 = NSLogEvents::JsRTSingleVarScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)69>;
  local_860 = NSLogEvents::JsRTSingleVarScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)69>;
  local_858 = 0x28;
  memcpy(this->m_eventListVTable + 0x45,local_880,0x30);
  local_8b0[0] = 2;
  local_8a8 = NSLogEvents::InstanceOfAction_Execute;
  local_8a0 = 0;
  local_898 = NSLogEvents::JsRTDoubleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)46>;
  local_890 = NSLogEvents::JsRTDoubleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)46>;
  local_888 = 0x28;
  memcpy(this->m_eventListVTable + 0x2e,local_8b0,0x30);
  local_8e0[0] = 2;
  local_8d8 = NSLogEvents::EqualsAction_Execute;
  local_8d0 = 0;
  local_8c8 = NSLogEvents::
              JsRTDoubleVarSingleScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)47>;
  local_8c0 = NSLogEvents::
              JsRTDoubleVarSingleScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)47>;
  local_8b8 = 0x30;
  memcpy(this->m_eventListVTable + 0x2f,local_8e0,0x30);
  local_910[0] = 2;
  local_908 = NSLogEvents::LessThanAction_Execute;
  local_900 = 0;
  local_8f8 = NSLogEvents::
              JsRTDoubleVarSingleScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)48>;
  local_8f0 = NSLogEvents::
              JsRTDoubleVarSingleScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)48>;
  local_8e8 = 0x30;
  memcpy(this->m_eventListVTable + 0x30,local_910,0x30);
  local_940[0] = 3;
  local_938 = NSLogEvents::GetPropertyIdFromSymbolAction_Execute;
  local_930 = 0;
  local_928 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)49>;
  local_920 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)49>;
  local_918 = 0x20;
  memcpy(this->m_eventListVTable + 0x31,local_940,0x30);
  local_970[0] = 2;
  local_968 = NSLogEvents::GetPrototypeAction_Execute;
  local_960 = 0;
  local_958 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)50>;
  local_950 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)50>;
  local_948 = 0x20;
  memcpy(this->m_eventListVTable + 0x32,local_970,0x30);
  local_9a0[0] = 2;
  local_998 = NSLogEvents::GetPropertyAction_Execute;
  local_990 = 0;
  local_988 = NSLogEvents::JsRTSingleVarScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)51>;
  local_980 = NSLogEvents::JsRTSingleVarScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)51>;
  local_978 = 0x28;
  memcpy(this->m_eventListVTable + 0x33,local_9a0,0x30);
  local_9d0[0] = 2;
  local_9c8 = NSLogEvents::GetIndexAction_Execute;
  local_9c0 = 0;
  local_9b8 = NSLogEvents::JsRTDoubleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)52>;
  local_9b0 = NSLogEvents::JsRTDoubleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)52>;
  local_9a8 = 0x28;
  memcpy(this->m_eventListVTable + 0x34,local_9d0,0x30);
  local_a00[0] = 2;
  local_9f8 = NSLogEvents::GetOwnPropertyInfoAction_Execute;
  local_9f0 = 0;
  local_9e8 = NSLogEvents::JsRTSingleVarScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)53>;
  local_9e0 = NSLogEvents::JsRTSingleVarScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)53>;
  local_9d8 = 0x28;
  memcpy(this->m_eventListVTable + 0x35,local_a00,0x30);
  local_a30[0] = 2;
  local_a28 = NSLogEvents::GetOwnPropertyNamesInfoAction_Execute;
  local_a20 = 0;
  local_a18 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)54>;
  local_a10 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)54>;
  local_a08 = 0x20;
  memcpy(this->m_eventListVTable + 0x36,local_a30,0x30);
  local_a60[0] = 2;
  local_a58 = NSLogEvents::GetOwnPropertySymbolsInfoAction_Execute;
  local_a50 = 0;
  local_a48 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)55>;
  local_a40 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)55>;
  local_a38 = 0x20;
  memcpy(this->m_eventListVTable + 0x37,local_a60,0x30);
  local_a90[0] = 2;
  local_a88 = NSLogEvents::DefinePropertyAction_Execute;
  local_a80 = 0;
  local_a78 = NSLogEvents::
              JsRTDoubleVarSingleScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)56>;
  local_a70 = NSLogEvents::
              JsRTDoubleVarSingleScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)56>;
  local_a68 = 0x30;
  memcpy(this->m_eventListVTable + 0x38,local_a90,0x30);
  local_ac0[0] = 2;
  local_ab8 = NSLogEvents::DeletePropertyAction_Execute;
  local_ab0 = 0;
  local_aa8 = NSLogEvents::
              JsRTSingleVarDoubleScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)57>;
  local_aa0 = NSLogEvents::
              JsRTSingleVarDoubleScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)57>;
  local_a98 = 0x30;
  memcpy(this->m_eventListVTable + 0x39,local_ac0,0x30);
  local_af0[0] = 2;
  local_ae8 = NSLogEvents::SetPrototypeAction_Execute;
  local_ae0 = 0;
  local_ad8 = NSLogEvents::JsRTDoubleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)58>;
  local_ad0 = NSLogEvents::JsRTDoubleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)58>;
  local_ac8 = 0x28;
  memcpy(this->m_eventListVTable + 0x3a,local_af0,0x30);
  local_b20[0] = 2;
  local_b18 = NSLogEvents::SetPropertyAction_Execute;
  local_b10 = 0;
  local_b08 = NSLogEvents::
              JsRTDoubleVarDoubleScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)59>;
  local_b00 = NSLogEvents::
              JsRTDoubleVarDoubleScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)59>;
  local_af8 = 0x38;
  memcpy(this->m_eventListVTable + 0x3b,local_b20,0x30);
  local_b50[0] = 2;
  local_b48 = NSLogEvents::SetIndexAction_Execute;
  local_b40 = 0;
  local_b38 = NSLogEvents::JsRTTrippleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)60>;
  local_b30 = NSLogEvents::JsRTTrippleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)60>;
  local_b28 = 0x30;
  memcpy(this->m_eventListVTable + 0x3c,local_b50,0x30);
  local_b80[0] = 0;
  local_b78 = NSLogEvents::GetTypedArrayInfoAction_Execute;
  local_b70 = 0;
  local_b68 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)61>;
  local_b60 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)61>;
  local_b58 = 0x20;
  memcpy(this->m_eventListVTable + 0x3d,local_b80,0x30);
  local_bb0[0] = 0;
  local_ba8 = NSLogEvents::GetDataViewInfoAction_Execute;
  local_ba0 = 0;
  local_b98 = NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)70>;
  local_b90 = NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)70>;
  local_b88 = 0x20;
  memcpy(this->m_eventListVTable + 0x46,local_bb0,0x30);
  local_be0[0] = 2;
  local_bd8 = NSLogEvents::RawBufferCopySync_Execute;
  local_bd0 = 0;
  local_bc8 = NSLogEvents::JsRTRawBufferCopyAction_Emit;
  local_bc0 = NSLogEvents::JsRTRawBufferCopyAction_Parse;
  local_bb8 = 0x30;
  memcpy(this->m_eventListVTable + 0x3e,local_be0,0x30);
  local_c10[0] = 2;
  local_c08 = NSLogEvents::RawBufferModifySync_Execute;
  local_c00 = NSLogEvents::
              JsRTRawBufferModifyAction_UnloadEventMemory<(TTD::NSLogEvents::EventKind)63>;
  local_bf8 = NSLogEvents::JsRTRawBufferModifyAction_Emit<(TTD::NSLogEvents::EventKind)63>;
  local_bf0 = NSLogEvents::JsRTRawBufferModifyAction_Parse<(TTD::NSLogEvents::EventKind)63>;
  local_be8 = 0x28;
  memcpy(this->m_eventListVTable + 0x3f,local_c10,0x30);
  local_c40[0] = 2;
  local_c38 = NSLogEvents::RawBufferAsyncModificationRegister_Execute;
  local_c30 = NSLogEvents::
              JsRTRawBufferModifyAction_UnloadEventMemory<(TTD::NSLogEvents::EventKind)64>;
  local_c28 = NSLogEvents::JsRTRawBufferModifyAction_Emit<(TTD::NSLogEvents::EventKind)64>;
  local_c20 = NSLogEvents::JsRTRawBufferModifyAction_Parse<(TTD::NSLogEvents::EventKind)64>;
  local_c18 = 0x28;
  memcpy(this->m_eventListVTable + 0x40,local_c40,0x30);
  local_c70[0] = 2;
  local_c68 = NSLogEvents::RawBufferAsyncModifyComplete_Execute;
  local_c60 = NSLogEvents::
              JsRTRawBufferModifyAction_UnloadEventMemory<(TTD::NSLogEvents::EventKind)65>;
  local_c58 = NSLogEvents::JsRTRawBufferModifyAction_Emit<(TTD::NSLogEvents::EventKind)65>;
  local_c50 = NSLogEvents::JsRTRawBufferModifyAction_Parse<(TTD::NSLogEvents::EventKind)65>;
  local_c48 = 0x28;
  memcpy(this->m_eventListVTable + 0x41,local_c70,0x30);
  local_ca0[0] = 2;
  local_c98 = NSLogEvents::JsRTConstructCallAction_Execute;
  local_c90 = NSLogEvents::JsRTConstructCallAction_UnloadEventMemory;
  local_c88 = NSLogEvents::JsRTConstructCallAction_Emit;
  local_c80 = NSLogEvents::JsRTConstructCallAction_Parse;
  local_c78 = 0x30;
  memcpy(this->m_eventListVTable + 0x42,local_ca0,0x30);
  local_cd0[0] = 3;
  local_cc8 = NSLogEvents::JsRTCodeParseAction_Execute;
  local_cc0 = NSLogEvents::JsRTCodeParseAction_UnloadEventMemory;
  local_cb8 = NSLogEvents::JsRTCodeParseAction_Emit;
  local_cb0 = NSLogEvents::JsRTCodeParseAction_Parse;
  local_ca8 = 0x50;
  memcpy(this->m_eventListVTable + 0x43,local_cd0,0x30);
  local_d00[0] = 2;
  local_cf8 = NSLogEvents::JsRTCallFunctionAction_Execute;
  local_cf0 = NSLogEvents::JsRTCallFunctionAction_UnloadEventMemory;
  local_ce8 = NSLogEvents::JsRTCallFunctionAction_Emit;
  local_ce0 = NSLogEvents::JsRTCallFunctionAction_Parse;
  local_cd8 = 0x58;
  memcpy(this->m_eventListVTable + 0x44,local_d00,0x30);
  return;
}

Assistant:

void EventLog::InitializeEventListVTable()
    {
        this->m_eventListVTable = this->m_miscSlabAllocator.SlabAllocateArray<NSLogEvents::EventLogEntryVTableEntry>((uint32)NSLogEvents::EventKind::Count);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(SnapshotTag, GlobalAPIWrapper, SnapshotEventLogEntry, nullptr, NSLogEvents::SnapshotEventLogEntry_UnloadEventMemory, NSLogEvents::SnapshotEventLogEntry_Emit, NSLogEvents::SnapshotEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(EventLoopYieldPointTag, GlobalAPIWrapper, EventLoopYieldPointEntry, nullptr, nullptr, NSLogEvents::EventLoopYieldPointEntry_Emit, NSLogEvents::EventLoopYieldPointEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(TopLevelCodeTag, None, CodeLoadEventLogEntry, nullptr, nullptr, NSLogEvents::CodeLoadEventLogEntry_Emit, NSLogEvents::CodeLoadEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(TelemetryLogTag, None, TelemetryEventLogEntry, nullptr, NSLogEvents::TelemetryEventLogEntry_UnloadEventMemory, NSLogEvents::TelemetryEventLogEntry_Emit, NSLogEvents::TelemetryEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(DoubleTag, None, DoubleEventLogEntry, nullptr, nullptr, NSLogEvents::DoubleEventLogEntry_Emit, NSLogEvents::DoubleEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(StringTag, None, StringValueEventLogEntry, nullptr, NSLogEvents::StringValueEventLogEntry_UnloadEventMemory, NSLogEvents::StringValueEventLogEntry_Emit, NSLogEvents::StringValueEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(RandomSeedTag, None, RandomSeedEventLogEntry, nullptr, nullptr, NSLogEvents::RandomSeedEventLogEntry_Emit, NSLogEvents::RandomSeedEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(PropertyEnumTag, None, PropertyEnumStepEventLogEntry, nullptr, NSLogEvents::PropertyEnumStepEventLogEntry_UnloadEventMemory, NSLogEvents::PropertyEnumStepEventLogEntry_Emit, NSLogEvents::PropertyEnumStepEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(SymbolCreationTag, None, SymbolCreationEventLogEntry, nullptr, nullptr, NSLogEvents::SymbolCreationEventLogEntry_Emit, NSLogEvents::SymbolCreationEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(WeakCollectionContainsTag, None, WeakCollectionContainsEventLogEntry, nullptr, nullptr, NSLogEvents::WeakCollectionContainsEventLogEntry_Emit, NSLogEvents::WeakCollectionContainsEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(ExternalCbRegisterCall, None, ExternalCbRegisterCallEventLogEntry, nullptr, nullptr, NSLogEvents::ExternalCbRegisterCallEventLogEntry_Emit, NSLogEvents::ExternalCbRegisterCallEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(ExternalCallTag, None, ExternalCallEventLogEntry, nullptr, NSLogEvents::ExternalCallEventLogEntry_UnloadEventMemory, NSLogEvents::ExternalCallEventLogEntry_Emit, NSLogEvents::ExternalCallEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(ExplicitLogWriteTag, None, ExplicitLogWriteEventLogEntry, nullptr, nullptr, NSLogEvents::ExplicitLogWriteEntry_Emit, NSLogEvents::ExplicitLogWriteEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(TTDInnerLoopLogWriteTag, None, TTDInnerLoopLogWriteEventLogEntry, nullptr, nullptr, NSLogEvents::TTDInnerLoopLogWriteEventLogEntry_Emit, NSLogEvents::TTDInnerLoopLogWriteEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(TTDFetchAutoTraceStatusTag, None, TTDFetchAutoTraceStatusEventLogEntry, nullptr, nullptr, NSLogEvents::TTDFetchAutoTraceStatusEventLogEntry_Emit, NSLogEvents::TTDFetchAutoTraceStatusEventLogEntry_Parse);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(CreateScriptContextActionTag, GlobalAPIWrapper, JsRTCreateScriptContextAction, NSLogEvents::CreateScriptContext_Execute, NSLogEvents::CreateScriptContext_UnloadEventMemory, NSLogEvents::CreateScriptContext_Emit, NSLogEvents::CreateScriptContext_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(SetActiveScriptContextActionTag, GlobalAPIWrapper, JsRTSingleVarArgumentAction, SetActiveScriptContext_Execute);

#if !INT32VAR
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateIntegerActionTag, ContextAPINoScriptWrapper, JsRTIntegralArgumentAction, CreateInt_Execute);
#endif

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(CreateNumberActionTag, ContextAPINoScriptWrapper, JsRTDoubleArgumentAction, NSLogEvents::CreateNumber_Execute, nullptr, NSLogEvents::JsRTDoubleArgumentAction_Emit<NSLogEvents::EventKind::CreateNumberActionTag>, NSLogEvents::JsRTDoubleArgumentAction_Parse<NSLogEvents::EventKind::CreateNumberActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateBooleanActionTag, ContextAPINoScriptWrapper, JsRTIntegralArgumentAction, CreateBoolean_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(CreateStringActionTag, ContextAPINoScriptWrapper, JsRTStringArgumentAction, NSLogEvents::CreateString_Execute, NSLogEvents::JsRTStringArgumentAction_UnloadEventMemory<NSLogEvents::EventKind::CreateStringActionTag>, NSLogEvents::JsRTStringArgumentAction_Emit<NSLogEvents::EventKind::CreateStringActionTag>, NSLogEvents::JsRTStringArgumentAction_Parse<NSLogEvents::EventKind::CreateStringActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateSymbolActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateSymbol_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateErrorActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateRangeErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateRangeErrorActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateReferenceErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateReferenceErrorActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateSyntaxErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateSyntaxErrorActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateTypeErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateTypeErrorActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateURIErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateURIErrorActionTag>);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(VarConvertToNumberActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, VarConvertToNumber_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(VarConvertToBooleanActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, VarConvertToBoolean_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(VarConvertToStringActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, VarConvertToString_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(VarConvertToObjectActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, VarConvertToObject_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AddRootRefActionTag, GlobalAPIWrapper, JsRTSingleVarArgumentAction, AddRootRef_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AddWeakRootRefActionTag, GlobalAPIWrapper, JsRTSingleVarArgumentAction, AddWeakRootRef_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AllocateObjectActionTag, ContextAPINoScriptWrapper, JsRTResultOnlyAction, AllocateObject_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AllocateExternalObjectActionTag, ContextAPINoScriptWrapper, JsRTSingleVarArgumentAction, AllocateExternalObject_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AllocateArrayActionTag, ContextAPINoScriptWrapper, JsRTIntegralArgumentAction, AllocateArrayAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AllocateArrayBufferActionTag, ContextAPIWrapper, JsRTIntegralArgumentAction, AllocateArrayBufferAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(AllocateExternalArrayBufferActionTag, ContextAPINoScriptWrapper, JsRTByteBufferAction, NSLogEvents::AllocateExternalArrayBufferAction_Execute, NSLogEvents::JsRTByteBufferAction_UnloadEventMemory<NSLogEvents::EventKind::AllocateExternalArrayBufferActionTag>, NSLogEvents::JsRTByteBufferAction_Emit<NSLogEvents::EventKind::AllocateExternalArrayBufferActionTag>, NSLogEvents::JsRTByteBufferAction_Parse<NSLogEvents::EventKind::AllocateExternalArrayBufferActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AllocateFunctionActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, AllocateFunctionAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(HostExitProcessTag, ContextAPIWrapper, JsRTIntegralArgumentAction, HostProcessExitAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetAndClearExceptionWithMetadataActionTag, None, JsRTResultOnlyAction, GetAndClearExceptionWithMetadataAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetAndClearExceptionActionTag, None, JsRTResultOnlyAction, GetAndClearExceptionAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(SetExceptionActionTag, ContextAPINoScriptWrapper, JsRTSingleVarScalarArgumentAction, SetExceptionAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(HasPropertyActionTag, ContextAPIWrapper, JsRTSingleVarScalarArgumentAction, HasPropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(HasOwnPropertyActionTag, ContextAPIWrapper, JsRTSingleVarScalarArgumentAction, HasOwnPropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(InstanceOfActionTag, ContextAPIWrapper, JsRTDoubleVarArgumentAction, InstanceOfAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(EqualsActionTag, ContextAPIWrapper, JsRTDoubleVarSingleScalarArgumentAction, EqualsAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(LessThanActionTag, ContextAPIWrapper, JsRTDoubleVarSingleScalarArgumentAction, LessThanAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetPropertyIdFromSymbolTag, ContextAPINoScriptWrapper, JsRTSingleVarArgumentAction, GetPropertyIdFromSymbolAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetPrototypeActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, GetPrototypeAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetPropertyActionTag, ContextAPIWrapper, JsRTSingleVarScalarArgumentAction, GetPropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetIndexActionTag, ContextAPIWrapper, JsRTDoubleVarArgumentAction, GetIndexAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetOwnPropertyInfoActionTag, ContextAPIWrapper, JsRTSingleVarScalarArgumentAction, GetOwnPropertyInfoAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetOwnPropertyNamesInfoActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, GetOwnPropertyNamesInfoAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetOwnPropertySymbolsInfoActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, GetOwnPropertySymbolsInfoAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(DefinePropertyActionTag, ContextAPIWrapper, JsRTDoubleVarSingleScalarArgumentAction, DefinePropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(DeletePropertyActionTag, ContextAPIWrapper, JsRTSingleVarDoubleScalarArgumentAction, DeletePropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(SetPrototypeActionTag, ContextAPIWrapper, JsRTDoubleVarArgumentAction, SetPrototypeAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(SetPropertyActionTag, ContextAPIWrapper, JsRTDoubleVarDoubleScalarArgumentAction, SetPropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(SetIndexActionTag, ContextAPIWrapper, JsRTTrippleVarArgumentAction, SetIndexAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetTypedArrayInfoActionTag, None, JsRTSingleVarArgumentAction, GetTypedArrayInfoAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetDataViewInfoActionTag, None, JsRTSingleVarArgumentAction, GetDataViewInfoAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(RawBufferCopySync, ContextAPIWrapper, JsRTRawBufferCopyAction, NSLogEvents::RawBufferCopySync_Execute, nullptr, NSLogEvents::JsRTRawBufferCopyAction_Emit, NSLogEvents::JsRTRawBufferCopyAction_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(RawBufferModifySync, ContextAPIWrapper, JsRTRawBufferModifyAction, NSLogEvents::RawBufferModifySync_Execute, NSLogEvents::JsRTRawBufferModifyAction_UnloadEventMemory<NSLogEvents::EventKind::RawBufferModifySync>, NSLogEvents::JsRTRawBufferModifyAction_Emit<NSLogEvents::EventKind::RawBufferModifySync>, NSLogEvents::JsRTRawBufferModifyAction_Parse<NSLogEvents::EventKind::RawBufferModifySync>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(RawBufferAsyncModificationRegister, ContextAPIWrapper, JsRTRawBufferModifyAction, NSLogEvents::RawBufferAsyncModificationRegister_Execute, NSLogEvents::JsRTRawBufferModifyAction_UnloadEventMemory<NSLogEvents::EventKind::RawBufferAsyncModificationRegister>, NSLogEvents::JsRTRawBufferModifyAction_Emit<NSLogEvents::EventKind::RawBufferAsyncModificationRegister>, NSLogEvents::JsRTRawBufferModifyAction_Parse<NSLogEvents::EventKind::RawBufferAsyncModificationRegister>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(RawBufferAsyncModifyComplete, ContextAPIWrapper, JsRTRawBufferModifyAction, NSLogEvents::RawBufferAsyncModifyComplete_Execute, NSLogEvents::JsRTRawBufferModifyAction_UnloadEventMemory<NSLogEvents::EventKind::RawBufferAsyncModifyComplete>, NSLogEvents::JsRTRawBufferModifyAction_Emit<NSLogEvents::EventKind::RawBufferAsyncModifyComplete>, NSLogEvents::JsRTRawBufferModifyAction_Parse<NSLogEvents::EventKind::RawBufferAsyncModifyComplete>);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(ConstructCallActionTag, ContextAPIWrapper, JsRTConstructCallAction, NSLogEvents::JsRTConstructCallAction_Execute, NSLogEvents::JsRTConstructCallAction_UnloadEventMemory, NSLogEvents::JsRTConstructCallAction_Emit, NSLogEvents::JsRTConstructCallAction_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(CodeParseActionTag, ContextAPINoScriptWrapper, JsRTCodeParseAction, NSLogEvents::JsRTCodeParseAction_Execute, NSLogEvents::JsRTCodeParseAction_UnloadEventMemory, NSLogEvents::JsRTCodeParseAction_Emit, NSLogEvents::JsRTCodeParseAction_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(CallExistingFunctionActionTag, ContextAPIWrapper, JsRTCallFunctionAction, NSLogEvents::JsRTCallFunctionAction_Execute, NSLogEvents::JsRTCallFunctionAction_UnloadEventMemory, NSLogEvents::JsRTCallFunctionAction_Emit, NSLogEvents::JsRTCallFunctionAction_Parse);
    }